

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O2

bool __thiscall Ptex::v2_2::PtexCachedReader::tryPrune(PtexCachedReader *this,size_t *memUsedChange)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  LOCK();
  bVar3 = this->_refCount == 0;
  if (bVar3) {
    this->_refCount = -1;
  }
  UNLOCK();
  if (bVar3) {
    PtexReader::prune(&this->super_PtexReader);
    sVar1 = (this->super_PtexReader)._memUsed;
    sVar2 = this->_memUsedAccountedFor;
    this->_memUsedAccountedFor = sVar1;
    *memUsedChange = sVar1 - sVar2;
    this->_refCount = 0;
  }
  return bVar3;
}

Assistant:

bool tryPrune(size_t& memUsedChange) {
        if (trylock()) {
            prune();
            memUsedChange = getMemUsedChange();
            unlock();
            return true;
        }
        return false;
    }